

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool medit_affect(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  char *txt;
  long lVar6;
  double dVar7;
  double dVar8;
  
  txt = "Syntax: affect [flag]\n\rType \'? affect\' for a list of flags.\n\r";
  if (*argument != '\0') {
    pvVar1 = ch->desc->pEdit;
    iVar2 = flag_value(affect_flags,argument);
    if (iVar2 != -99) {
      iVar3 = iVar2 + 0x1f;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      lVar6 = (long)(iVar3 >> 5);
      uVar4 = *(ulong *)((long)pvVar1 + lVar6 * 8 + 0x88);
      dVar7 = ldexp(1.0,iVar2 % 0x20);
      dVar8 = ldexp(1.0,iVar2 % 0x20);
      if ((uVar4 & (long)dVar7) == 0) {
        uVar4 = (long)dVar8 | *(ulong *)((long)pvVar1 + lVar6 * 8 + 0x88);
      }
      else {
        uVar4 = ~(long)dVar8 & *(ulong *)((long)pvVar1 + lVar6 * 8 + 0x88);
      }
      *(ulong *)((long)pvVar1 + lVar6 * 8 + 0x88) = uVar4;
      bVar5 = true;
      txt = "Affect flag toggled.\n\r";
      goto LAB_00367c2d;
    }
  }
  bVar5 = false;
LAB_00367c2d:
  send_to_char(txt,ch);
  return bVar5;
}

Assistant:

bool medit_affect(CHAR_DATA *ch, char *argument) /* Moved out of medit() due to naming conflicts -- Hugin */
{
	MOB_INDEX_DATA *pMob;
	int value;

	if (argument[0] != '\0')
	{
		EDIT_MOB(ch, pMob);

		value = flag_value(affect_flags, argument);
		if ((value) != NO_FLAG)
		{
			TOGGLE_BIT(pMob->affected_by, value);

			send_to_char("Affect flag toggled.\n\r", ch);
			return true;
		}
	}

	send_to_char("Syntax: affect [flag]\n\r"\
				 "Type '? affect' for a list of flags.\n\r", ch);
	return false;
}